

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O1

Dec_Edge_t Rwt_TravCollect_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,Dec_Graph_t *pGraph)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Dec_Node_t *pDVar4;
  size_t sVar5;
  Dec_Edge_t DVar6;
  Dec_Edge_t DVar7;
  Dec_Node_t *pDVar8;
  
  if ((*(uint *)&pNode->field_0x8 >> 0x1e & 1) == 0) {
    if (pNode->TravId == p->nTravIds) {
      DVar6 = (Dec_Edge_t)(*(uint *)&pNode->field_0x8 >> 0x10 & 0xff);
    }
    else {
      pNode->TravId = p->nTravIds;
      DVar6 = Rwt_TravCollect_rec(p,(Rwt_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pGraph);
      DVar6 = (Dec_Edge_t)(*(uint *)&pNode->p0 & 1 ^ (uint)DVar6);
      DVar7 = Rwt_TravCollect_rec(p,(Rwt_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),pGraph);
      DVar7 = (Dec_Edge_t)(*(uint *)&pNode->p1 & 1 ^ (uint)DVar7);
      if (*(int *)&pNode->field_0x8 < 0) {
        if (pGraph->nSize == pGraph->nCap) {
          sVar5 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar5);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar5);
          }
          pGraph->pNodes = pDVar8;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar1 = pGraph->nSize;
        pGraph->nSize = iVar1 + 1;
        pDVar8 = pDVar4 + iVar1;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar1].field_0x10 = 0;
        pDVar4[iVar1].eEdge0 = (Dec_Edge_t)((uint)DVar6 ^ 1);
        pDVar4[iVar1].eEdge1 = DVar7;
        *(uint *)&pDVar4[iVar1].field_0x10 =
             ((uint)DVar7 & 1) << 0x10 | (((uint)DVar6 ^ 1) & 1) << 0xf;
        iVar1 = pGraph->nSize;
        if (iVar1 == pGraph->nCap) {
          sVar5 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar5);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar5);
          }
          pGraph->pNodes = pDVar8;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar2 = pGraph->nSize;
        pGraph->nSize = iVar2 + 1;
        pDVar8 = pDVar4 + iVar2;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar2].field_0x10 = 0;
        pDVar4[iVar2].eEdge0 = DVar6;
        pDVar4[iVar2].eEdge1 = (Dec_Edge_t)((uint)DVar7 ^ 1);
        *(uint *)&pDVar4[iVar2].field_0x10 =
             (((uint)DVar7 ^ 1) & 1) << 0x10 | ((uint)DVar6 & 1) << 0xf;
        iVar2 = pGraph->nSize;
        if (iVar2 == pGraph->nCap) {
          sVar5 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar5);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar5);
          }
          pGraph->pNodes = pDVar8;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar3 = pGraph->nSize;
        pGraph->nSize = iVar3 + 1;
        pDVar8 = pDVar4 + iVar3;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar3].field_0x10 = 0;
        *(undefined4 *)&pDVar4[iVar3].field_0x10 = 0x4000;
        pDVar4[iVar3].eEdge0 = (Dec_Edge_t)((iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
        pDVar4[iVar3].eEdge1 = (Dec_Edge_t)((iVar2 * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
        DVar6 = (Dec_Edge_t)((pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
      }
      else {
        if (pGraph->nSize == pGraph->nCap) {
          sVar5 = (long)pGraph->nCap * 0x30;
          if (pGraph->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar5);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pGraph->pNodes,sVar5);
          }
          pGraph->pNodes = pDVar8;
          pGraph->nCap = pGraph->nCap << 1;
        }
        pDVar4 = pGraph->pNodes;
        iVar1 = pGraph->nSize;
        pGraph->nSize = iVar1 + 1;
        pDVar8 = pDVar4 + iVar1;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar4[iVar1].field_0x10 = 0;
        pDVar4[iVar1].eEdge0 = DVar6;
        pDVar4[iVar1].eEdge1 = DVar7;
        *(uint *)&pDVar4[iVar1].field_0x10 = ((uint)DVar7 & 1) << 0x10 | ((uint)DVar6 & 1) << 0xf;
        DVar6 = (Dec_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
      }
      pNode->field_0xa = DVar6._0_1_;
    }
  }
  else {
    DVar6 = (Dec_Edge_t)(pNode->Id * 2 + 0x7ffffffeU & 0x7ffffffe);
  }
  return DVar6;
}

Assistant:

Dec_Edge_t Rwt_TravCollect_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, Dec_Graph_t * pGraph )
{
    Dec_Edge_t eNode0, eNode1, eNode;
    // elementary variable
    if ( pNode->fUsed )
        return Dec_EdgeCreate( pNode->Id - 1, 0 );
    // previously visited node
    if ( pNode->TravId == p->nTravIds )
        return Dec_IntToEdge( pNode->Volume );
    pNode->TravId = p->nTravIds;
    // solve for children
    eNode0 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p0), pGraph );
    if ( Rwt_IsComplement(pNode->p0) )    
        eNode0.fCompl = !eNode0.fCompl;
    eNode1 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p1), pGraph );
    if ( Rwt_IsComplement(pNode->p1) )    
        eNode1.fCompl = !eNode1.fCompl;
    // create the decomposition node(s)
    if ( pNode->fExor )
        eNode = Dec_GraphAddNodeXor( pGraph, eNode0, eNode1, 0 );
    else
        eNode = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    // save the result
    pNode->Volume = Dec_EdgeToInt( eNode );
    return eNode;
}